

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableNT.cpp
# Opt level: O2

double __thiscall adios2::VariableNT::MaxDouble(VariableNT *this,size_t step)

{
  VariableBase *pVVar1;
  char cVar2;
  byte bVar3;
  short sVar4;
  ushort uVar5;
  uint uVar6;
  ulong uVar7;
  undefined8 uVar8;
  float fVar9;
  double dVar10;
  undefined1 auVar11 [16];
  allocator local_fb;
  allocator local_fa;
  allocator local_f9;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  string local_58;
  string local_38;
  
  pVVar1 = this->m_Variable;
  std::__cxx11::string::string
            ((string *)&local_38,"in call to VariableNT::MaxDouble",(allocator *)&local_f8);
  helper::CheckForNullptr<adios2::core::VariableBase>(pVVar1,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  pVVar1 = this->m_Variable;
  switch(*(undefined4 *)(pVVar1 + 0x28)) {
  case 1:
    cVar2 = adios2::core::Variable<signed_char>::Max((ulong)pVVar1);
    uVar6 = (uint)cVar2;
    break;
  case 2:
    sVar4 = adios2::core::Variable<short>::Max((ulong)pVVar1);
    uVar6 = (uint)sVar4;
    break;
  case 3:
    uVar6 = adios2::core::Variable<int>::Max((ulong)pVVar1);
    break;
  case 4:
    uVar7 = adios2::core::Variable<long>::Max((ulong)pVVar1);
    goto LAB_001e459c;
  case 5:
    bVar3 = adios2::core::Variable<unsigned_char>::Max((ulong)pVVar1);
    uVar6 = (uint)bVar3;
    break;
  case 6:
    uVar5 = adios2::core::Variable<unsigned_short>::Max((ulong)pVVar1);
    uVar6 = (uint)uVar5;
    break;
  case 7:
    uVar6 = adios2::core::Variable<unsigned_int>::Max((ulong)pVVar1);
    uVar7 = (ulong)uVar6;
LAB_001e459c:
    return (double)(long)uVar7;
  case 8:
    uVar8 = adios2::core::Variable<unsigned_long>::Max((ulong)pVVar1);
    auVar11._8_4_ = (int)((ulong)uVar8 >> 0x20);
    auVar11._0_8_ = uVar8;
    auVar11._12_4_ = 0x45300000;
    return (auVar11._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar8) - 4503599627370496.0);
  case 9:
    fVar9 = (float)adios2::core::Variable<float>::Max((ulong)pVVar1);
    return (double)fVar9;
  case 10:
    dVar10 = (double)adios2::core::Variable<double>::Max((ulong)pVVar1);
    return dVar10;
  default:
    std::__cxx11::string::string((string *)&local_f8,"bindings::CXX11",&local_f9);
    std::__cxx11::string::string((string *)&local_58,"VariableNT",&local_fa);
    std::__cxx11::string::string((string *)&local_78,"MaxDouble",&local_fb);
    adios2::ToString_abi_cxx11_((DataType)&local_d8);
    std::operator+(&local_b8,"invalid data type ",&local_d8);
    std::operator+(&local_98,&local_b8,", only basic numeric types support this API");
    helper::Throw<std::runtime_error>(&local_f8,&local_58,&local_78,&local_98,-1);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_f8);
    return 0.0;
  }
  return (double)(int)uVar6;
}

Assistant:

double VariableNT::MaxDouble(const size_t step) const
{
    helper::CheckForNullptr(m_Variable, "in call to VariableNT::MaxDouble");
    if (m_Variable->m_Type == DataType::Int8)
    {
        return static_cast<double>(
            reinterpret_cast<core::Variable<int8_t> *>(m_Variable)->Max(step));
    }
    else if (m_Variable->m_Type == DataType::UInt8)
    {
        return static_cast<double>(
            reinterpret_cast<core::Variable<uint8_t> *>(m_Variable)->Max(step));
    }
    else if (m_Variable->m_Type == DataType::Int16)
    {
        return static_cast<double>(
            reinterpret_cast<core::Variable<int16_t> *>(m_Variable)->Max(step));
    }
    else if (m_Variable->m_Type == DataType::UInt16)
    {
        return static_cast<double>(
            reinterpret_cast<core::Variable<uint16_t> *>(m_Variable)->Max(step));
    }
    else if (m_Variable->m_Type == DataType::Int32)
    {
        return static_cast<double>(
            reinterpret_cast<core::Variable<int32_t> *>(m_Variable)->Max(step));
    }
    else if (m_Variable->m_Type == DataType::UInt32)
    {
        return static_cast<double>(
            reinterpret_cast<core::Variable<uint32_t> *>(m_Variable)->Max(step));
    }
    else if (m_Variable->m_Type == DataType::Int64)
    {
        return static_cast<double>(
            reinterpret_cast<core::Variable<int64_t> *>(m_Variable)->Max(step));
    }
    else if (m_Variable->m_Type == DataType::UInt64)
    {
        return static_cast<double>(
            reinterpret_cast<core::Variable<uint64_t> *>(m_Variable)->Max(step));
    }
    else if (m_Variable->m_Type == DataType::Float)
    {
        return static_cast<double>(
            reinterpret_cast<core::Variable<float> *>(m_Variable)->Max(step));
    }
    else if (m_Variable->m_Type == DataType::Double)
    {
        return static_cast<double>(
            reinterpret_cast<core::Variable<double> *>(m_Variable)->Max(step));
    }
    helper::Throw<std::runtime_error>("bindings::CXX11", "VariableNT", "MaxDouble",
                                      "invalid data type " + ToString(m_Variable->m_Type) +
                                          ", only basic numeric types support this API");
    return 0;
}